

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O0

ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> * __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::GetReleaseQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  *this,SoftwareQueueIndex QueueInd)

{
  CommandQueue *pCVar1;
  Uint32 UVar2;
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *this_local;
  SoftwareQueueIndex QueueInd_local;
  
  msg.field_2._8_8_ = this;
  this_local._7_1_ = QueueInd.m_Value;
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  if (this->m_CmdQueueCount <= (ulong)UVar2) {
    FormatString<char[26],char[27]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xc108a8,
               (char (*) [27])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetReleaseQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0xf0);
    std::__cxx11::string::~string((string *)local_38);
  }
  pCVar1 = this->m_CommandQueues;
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  return &pCVar1[UVar2].ReleaseQueue;
}

Assistant:

ResourceReleaseQueue<DynamicStaleResourceWrapper>& GetReleaseQueue(SoftwareQueueIndex QueueInd)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        return m_CommandQueues[QueueInd].ReleaseQueue;
    }